

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_is_valid_asn1_bitstring(CBS *cbs)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  
  uVar1 = cbs->len;
  uVar3 = 0;
  uVar5 = uVar1 - 1;
  uVar2 = 0;
  if (uVar1 != 0) {
    uVar5 = (ulong)*cbs->data;
    uVar2 = uVar1 - 1;
  }
  bVar4 = (byte)uVar5;
  if (bVar4 < 8 && uVar1 != 0) {
    if (bVar4 == 0) {
      return 1;
    }
    uVar3 = 0;
    if (1 < uVar1) {
      uVar3 = (uint)(((uint)cbs->data[uVar2 + ((ulong)(uVar1 != 0) - 1)] & ~(-1 << (bVar4 & 0x1f)))
                    == 0);
    }
  }
  return uVar3;
}

Assistant:

int CBS_is_valid_asn1_bitstring(const CBS *cbs) {
  CBS in = *cbs;
  uint8_t num_unused_bits;
  if (!CBS_get_u8(&in, &num_unused_bits) || num_unused_bits > 7) {
    return 0;
  }

  if (num_unused_bits == 0) {
    return 1;
  }

  // All num_unused_bits bits must exist and be zeros.
  uint8_t last;
  if (!CBS_get_last_u8(&in, &last) ||
      (last & ((1 << num_unused_bits) - 1)) != 0) {
    return 0;
  }

  return 1;
}